

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressSequencesLong
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  BYTE *prefixStart;
  undefined8 uVar6;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  seq_t sequence_02;
  seq_t sequence_03;
  seq_t sequence_04;
  U32 i;
  long lVar7;
  BYTE **ppBVar8;
  BYTE *pBVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  BYTE *pBVar13;
  uint uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  size_t sVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  BYTE *pBVar21;
  uint uVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  BYTE *oend;
  ulong uVar25;
  BYTE *pBVar26;
  ulong uVar27;
  uint uVar28;
  bool bVar29;
  BYTE *litPtr;
  seqState_t seqState;
  seq_t sequences [8];
  BYTE *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  BYTE *local_1d8;
  ulong local_1d0;
  BYTE *local_1c8;
  BYTE *local_1c0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  BIT_DStream_t local_1a8;
  ZSTD_fseState local_180;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  BYTE *local_150 [3];
  ulong uStack_138;
  BYTE *local_130;
  BYTE *local_128;
  BYTE *local_120;
  BYTE *local_118;
  ulong *local_110;
  BYTE *local_108;
  int local_fc;
  ulong local_f8 [25];
  
  if (dctx->litBufferLocation == ZSTD_in_dst) {
    local_1f0 = dctx->litBuffer;
  }
  else {
    local_1f0 = (BYTE *)(maxDstSize + (long)dst);
  }
  pBVar9 = dctx->litPtr;
  pBVar21 = dctx->litBufferEnd;
  local_200 = pBVar9;
  local_1b0 = (BYTE *)dst;
  if (nbSeq != 0) {
    prefixStart = (BYTE *)dctx->prefixStart;
    local_1c0 = (BYTE *)dctx->virtualStart;
    local_1d8 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    lVar7 = -0xc;
    do {
      *(ulong *)((long)&uStack_138 + lVar7 * 2) =
           (ulong)*(uint *)((long)(dctx->entropy).workspace + lVar7);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0);
    iVar19 = 8;
    if (nbSeq < 8) {
      iVar19 = nbSeq;
    }
    if (dst == (void *)0x0) {
      __assert_fail("dst != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x6c0,
                    "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    local_1e8 = (BYTE *)((long)dst - (long)prefixStart);
    if ((long)seqSize < 0) {
      __assert_fail("iend >= ip",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x6c1,
                    "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                   );
    }
    if (seqSize == 0) {
      local_1a8.ptr = (char *)0x0;
      local_1a8.start = (char *)0x0;
      local_1a8.bitContainer = 0;
      local_1a8.bitsConsumed = 0;
      local_1a8._12_4_ = 0;
      local_1a8.limitPtr = (char *)0x0;
    }
    else {
      local_1a8.limitPtr = (char *)((long)seqStart + 8);
      local_1a8.start = (char *)seqStart;
      if (seqSize < 8) {
        local_1a8.bitContainer = (size_t)*seqStart;
        switch(seqSize) {
        case 7:
          local_1a8.bitContainer =
               (ulong)*(byte *)((long)seqStart + 6) << 0x30 | local_1a8.bitContainer;
        case 6:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)seqStart + 5) << 0x28);
        case 5:
          local_1a8.bitContainer =
               local_1a8.bitContainer + ((ulong)*(byte *)((long)seqStart + 4) << 0x20);
        case 4:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 3) * 0x1000000;
        case 3:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 2) * 0x10000;
        case 2:
          local_1a8.bitContainer =
               local_1a8.bitContainer + (ulong)*(byte *)((long)seqStart + 1) * 0x100;
        }
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        uVar28 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar28 + 9;
        if (bVar1 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        local_1a8.ptr = (char *)seqStart;
        if (bVar1 != 0) {
          local_1a8.bitsConsumed = local_1a8.bitsConsumed + (int)seqSize * -8 + 0x40;
          goto LAB_00706ae5;
        }
      }
      else {
        local_1a8.ptr = (char *)((long)seqStart + (seqSize - 8));
        local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
        bVar1 = *(byte *)((long)seqStart + (seqSize - 1));
        uVar28 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
          }
        }
        local_1a8.bitsConsumed = ~uVar28 + 9;
        if (bVar1 == 0) {
          local_1a8.bitsConsumed = 0;
        }
        if (bVar1 != 0) {
LAB_00706ae5:
          local_1f8 = pBVar21;
          ZSTD_initFseState(&local_180,&local_1a8,dctx->LLTptr);
          ZSTD_initFseState(&local_170,&local_1a8,dctx->OFTptr);
          ZSTD_initFseState(&local_160,&local_1a8,dctx->MLTptr);
          local_fc = iVar19;
          local_1c8 = (BYTE *)(long)iVar19;
          puVar23 = local_f8 + 2;
          uVar18 = 0;
          do {
            uVar28 = local_1a8.bitsConsumed;
            if (local_1a8.bitsConsumed < 0x41) {
              if (local_1a8.ptr < local_1a8.limitPtr) {
                if (local_1a8.ptr == local_1a8.start) goto LAB_00706bd4;
                uVar22 = (int)local_1a8.ptr - (int)local_1a8.start;
                if (local_1a8.start <=
                    (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3))) {
                  uVar22 = local_1a8.bitsConsumed >> 3;
                }
                uVar14 = local_1a8.bitsConsumed + uVar22 * -8;
              }
              else {
                uVar22 = local_1a8.bitsConsumed >> 3;
                uVar14 = local_1a8.bitsConsumed & 7;
              }
              local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar22);
              local_1a8.bitsConsumed = uVar14;
              local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
            }
LAB_00706bd4:
            if ((0x40 < uVar28) || ((long)local_1c8 <= (long)uVar18)) {
              dst = local_1b0;
              if ((long)uVar18 < (long)local_1c8) goto LAB_007080f7;
              local_130 = local_1f0 + -0x20;
              local_118 = dctx->litExtraBuffer;
              local_120 = dctx->litExtraBuffer + 0x10000;
              local_108 = dctx->litExtraBuffer + 0x10;
              goto LAB_0070704d;
            }
            bVar1 = local_180.table[local_180.state].nbAdditionalBits;
            if (0x10 < bVar1) goto LAB_00708d97;
            bVar11 = local_160.table[local_160.state].nbAdditionalBits;
            if (0x10 < bVar11) goto LAB_00708d59;
            local_110 = puVar23;
            bVar2 = local_170.table[local_170.state].nbAdditionalBits;
            if (0x1f < bVar2) goto LAB_00708d78;
            uVar20 = (ulong)local_160.table[local_160.state].baseValue;
            uVar28 = local_180.table[local_180.state].baseValue;
            uVar27 = (ulong)uVar28;
            uVar5 = local_180.table[local_180.state].nextState;
            local_1e0 = (BYTE *)(ulong)local_160.table[local_160.state].nextState;
            local_1d0 = (ulong)local_170.table[local_170.state].nextState;
            bVar3 = local_180.table[local_180.state].nbBits;
            bVar4 = local_160.table[local_160.state].nbBits;
            uVar22 = (uint)local_170.table[local_170.state].nbBits;
            bVar10 = (byte)local_1a8.bitsConsumed;
            if (bVar2 < 2) {
              if (bVar2 == 0) {
                pBVar9 = local_150[uVar28 == 0];
                ppBVar8 = local_150 + (uVar28 != 0);
              }
              else {
                local_1a8.bitsConsumed = local_1a8.bitsConsumed + 1;
                lVar7 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar28 == 0)) -
                        ((long)(local_1a8.bitContainer << (bVar10 & 0x3f)) >> 0x3f);
                if (lVar7 == 3) {
                  local_150[0] = local_150[0] + -1;
                }
                else {
                  local_150[0] = local_150[lVar7];
                }
                pBVar9 = local_150[0] + (local_150[0] == (BYTE *)0x0);
                if (lVar7 != 1) {
                  local_150[2] = local_150[1];
                }
                ppBVar8 = local_150;
              }
            }
            else {
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar2;
              pBVar9 = (BYTE *)(((local_1a8.bitContainer << (bVar10 & 0x3f)) >> (-bVar2 & 0x3f)) +
                               (ulong)local_170.table[local_170.state].baseValue);
              local_150[2] = local_150[1];
              ppBVar8 = local_150;
            }
            local_150[1] = *ppBVar8;
            local_150[0] = pBVar9;
            if (bVar11 != 0) {
              bVar10 = (byte)local_1a8.bitsConsumed;
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar11;
              uVar20 = uVar20 + ((local_1a8.bitContainer << (bVar10 & 0x3f)) >> (-bVar11 & 0x3f));
            }
            if ((0x1e < (byte)(bVar11 + bVar1 + bVar2)) && (local_1a8.bitsConsumed < 0x41)) {
              if (local_1a8.ptr < local_1a8.limitPtr) {
                if (local_1a8.ptr != local_1a8.start) {
                  uVar28 = (int)local_1a8.ptr - (int)local_1a8.start;
                  if (local_1a8.start <=
                      (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3))) {
                    uVar28 = local_1a8.bitsConsumed >> 3;
                  }
                  local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar28);
                  local_1a8.bitsConsumed = local_1a8.bitsConsumed + uVar28 * -8;
                  local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
                }
              }
              else {
                local_1b8 = (BYTE *)CONCAT44(local_1b8._4_4_,uVar22);
                BIT_reloadDStreamFast(&local_1a8);
                uVar22 = (uint)local_1b8;
              }
            }
            if (bVar1 != 0) {
              bVar11 = (byte)local_1a8.bitsConsumed;
              local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar1;
              uVar27 = uVar27 + ((local_1a8.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
            }
            if (0x1f < bVar3) goto LAB_00708d3a;
            uVar28 = bVar3 + local_1a8.bitsConsumed;
            local_180.state =
                 (~(-1L << (bVar3 & 0x3f)) & local_1a8.bitContainer >> (-(char)uVar28 & 0x3fU)) +
                 (ulong)uVar5;
            local_1a8.bitsConsumed = uVar28;
            if (0x1f < bVar4) goto LAB_00708d3a;
            local_1a8.bitsConsumed = uVar28 + bVar4;
            local_160.state =
                 (size_t)(local_1e0 +
                         (~(-1L << (bVar4 & 0x3f)) &
                         local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU)));
            if (0x1f < (byte)uVar22) goto LAB_00708d3a;
            local_170.state =
                 (~(-1L << ((byte)uVar22 & 0x3f)) &
                 local_1a8.bitContainer >> (-(char)(local_1a8.bitsConsumed + uVar22) & 0x3fU)) +
                 local_1d0;
            local_1a8.bitsConsumed = local_1a8.bitsConsumed + uVar22;
            local_1e8 = local_1e8 + uVar27 + uVar20;
            local_110[-2] = uVar27;
            local_110[-1] = uVar20;
            *local_110 = (ulong)pBVar9;
            uVar18 = uVar18 + 1;
            puVar23 = local_110 + 3;
          } while( true );
        }
      }
    }
    bVar29 = false;
    pBVar9 = (BYTE *)0xffffffffffffffec;
    goto LAB_00708c45;
  }
  goto LAB_00708c55;
LAB_0070704d:
  uVar28 = local_1a8.bitsConsumed;
  if (local_1a8.bitsConsumed < 0x41) {
    if (local_1a8.ptr < local_1a8.limitPtr) {
      if (local_1a8.ptr == local_1a8.start) goto LAB_007070ce;
      uVar22 = (int)local_1a8.ptr - (int)local_1a8.start;
      if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3)))
      {
        uVar22 = local_1a8.bitsConsumed >> 3;
      }
      uVar14 = local_1a8.bitsConsumed + uVar22 * -8;
    }
    else {
      uVar22 = local_1a8.bitsConsumed >> 3;
      uVar14 = local_1a8.bitsConsumed & 7;
    }
    local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar22);
    local_1a8.bitsConsumed = uVar14;
    local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
  }
LAB_007070ce:
  uVar22 = (uint)uVar18;
  if ((0x40 < uVar28) || (nbSeq <= (int)uVar22)) {
    if ((int)uVar22 < nbSeq) goto LAB_007080f7;
    uVar22 = uVar22 - local_fc;
    pBVar21 = local_1f8;
    pBVar9 = local_1b8;
    goto joined_r0x00708122;
  }
  bVar1 = local_180.table[local_180.state].nbAdditionalBits;
  if (0x10 < bVar1) {
LAB_00708d97:
    __assert_fail("llBits <= MaxLLBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4c8,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar11 = local_160.table[local_160.state].nbAdditionalBits;
  if (0x10 < bVar11) {
LAB_00708d59:
    __assert_fail("mlBits <= MaxMLBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4c9,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  bVar2 = local_170.table[local_170.state].nbAdditionalBits;
  if (0x1f < bVar2) {
LAB_00708d78:
    __assert_fail("ofBits <= MaxOff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                  ,0x4ca,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
  }
  local_110 = (ulong *)(ulong)local_160.table[local_160.state].baseValue;
  uVar28 = local_180.table[local_180.state].baseValue;
  uVar18 = (ulong)uVar28;
  local_1e0 = (BYTE *)(ulong)local_180.table[local_180.state].nextState;
  local_1d0 = (ulong)local_160.table[local_160.state].nextState;
  local_1c8 = (BYTE *)(ulong)local_170.table[local_170.state].nextState;
  bVar3 = local_180.table[local_180.state].nbBits;
  bVar4 = local_160.table[local_160.state].nbBits;
  bVar10 = local_170.table[local_170.state].nbBits;
  bVar12 = (byte)local_1a8.bitsConsumed;
  if (bVar2 < 2) {
    if (bVar2 == 0) {
      pBVar21 = local_150[uVar28 == 0];
      ppBVar8 = local_150 + (uVar28 != 0);
    }
    else {
      local_1a8.bitsConsumed = local_1a8.bitsConsumed + 1;
      lVar7 = (ulong)(local_170.table[local_170.state].baseValue + (uint)(uVar28 == 0)) -
              ((long)(local_1a8.bitContainer << (bVar12 & 0x3f)) >> 0x3f);
      if (lVar7 == 3) {
        local_150[0] = local_150[0] + -1;
      }
      else {
        local_150[0] = local_150[lVar7];
      }
      pBVar21 = local_150[0] + (local_150[0] == (BYTE *)0x0);
      if (lVar7 != 1) {
        local_150[2] = local_150[1];
      }
      ppBVar8 = local_150;
    }
  }
  else {
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar2;
    pBVar21 = (BYTE *)(((local_1a8.bitContainer << (bVar12 & 0x3f)) >> (-bVar2 & 0x3f)) +
                      (ulong)local_170.table[local_170.state].baseValue);
    local_150[2] = local_150[1];
    ppBVar8 = local_150;
  }
  local_150[1] = *ppBVar8;
  local_150[0] = pBVar21;
  if (bVar11 != 0) {
    bVar12 = (byte)local_1a8.bitsConsumed;
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar11;
    local_110 = (ulong *)((long)(ulong)local_160.table[local_160.state].baseValue +
                         ((local_1a8.bitContainer << (bVar12 & 0x3f)) >> (-bVar11 & 0x3f)));
  }
  if ((0x1e < (byte)(bVar11 + bVar1 + bVar2)) && (local_1a8.bitsConsumed < 0x41)) {
    if (local_1a8.ptr < local_1a8.limitPtr) {
      if (local_1a8.ptr != local_1a8.start) {
        uVar28 = (int)local_1a8.ptr - (int)local_1a8.start;
        if (local_1a8.start <= (ulong *)((long)local_1a8.ptr - (ulong)(local_1a8.bitsConsumed >> 3))
           ) {
          uVar28 = local_1a8.bitsConsumed >> 3;
        }
        local_1a8.ptr = (char *)((long)local_1a8.ptr - (ulong)uVar28);
        local_1a8.bitsConsumed = local_1a8.bitsConsumed + uVar28 * -8;
        local_1a8.bitContainer = *(size_t *)local_1a8.ptr;
      }
    }
    else {
      BIT_reloadDStreamFast(&local_1a8);
    }
  }
  if (bVar1 != 0) {
    bVar11 = (byte)local_1a8.bitsConsumed;
    local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar1;
    uVar18 = uVar18 + ((local_1a8.bitContainer << (bVar11 & 0x3f)) >> (-bVar1 & 0x3f));
  }
  if (0x1f < bVar3) {
LAB_00708d3a:
    __assert_fail("nbBits < BIT_MASK_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                  ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
  }
  uVar28 = bVar3 + local_1a8.bitsConsumed;
  local_180.state =
       (size_t)(local_1e0 +
               (~(-1L << (bVar3 & 0x3f)) & local_1a8.bitContainer >> (-(char)uVar28 & 0x3fU)));
  local_1a8.bitsConsumed = uVar28;
  if (0x1f < bVar4) goto LAB_00708d3a;
  local_1a8.bitsConsumed = uVar28 + bVar4;
  local_160.state =
       (~(-1L << (bVar4 & 0x3f)) & local_1a8.bitContainer >> (-(char)local_1a8.bitsConsumed & 0x3fU)
       ) + local_1d0;
  if (0x1f < bVar10) goto LAB_00708d3a;
  local_170.state =
       (size_t)(local_1c8 +
               (~(-1L << (bVar10 & 0x3f)) &
               local_1a8.bitContainer >> (-(char)(local_1a8.bitsConsumed + bVar10) & 0x3fU)));
  local_1a8.bitsConsumed = local_1a8.bitsConsumed + bVar10;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar20 = (ulong)(uVar22 & 7);
    puVar23 = local_f8 + uVar20 * 3;
    uVar27 = *puVar23;
    pBVar24 = local_200 + uVar27;
    if (dctx->litBufferEnd < pBVar24) {
      uVar27 = (long)dctx->litBufferEnd - (long)local_200;
      if (uVar27 != 0) {
        if (uVar27 <= (ulong)((long)local_1f0 - (long)dst)) {
          ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_200,uVar27);
          *puVar23 = *puVar23 - uVar27;
          dst = (void *)((long)dst + uVar27);
          goto LAB_0070780f;
        }
        pBVar9 = (BYTE *)0xffffffffffffffba;
        goto LAB_007077d1;
      }
LAB_0070780f:
      local_200 = local_118;
      dctx->litBufferLocation = ZSTD_not_in_dst;
      if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00708dd5;
      uVar27 = *puVar23;
      if ((long)uVar27 < 0x10001) {
        sVar17 = local_f8[uVar20 * 3 + 1];
        pBVar9 = (BYTE *)(uVar27 + sVar17);
        pBVar24 = (BYTE *)((long)dst + (long)pBVar9);
        if (local_130 < pBVar24) goto LAB_00707ca1;
        if ((long)uVar27 < 0) goto LAB_00708e13;
        if ((long)pBVar9 <= (long)uVar27) goto LAB_00708df4;
        if (local_1f0 < pBVar24) goto LAB_00708e32;
        pBVar26 = (BYTE *)((long)dst + uVar27);
        local_1f8 = pBVar24;
        if (local_130 < pBVar26) goto LAB_00708e51;
        uVar25 = local_f8[uVar20 * 3 + 2];
        uVar6 = *(undefined8 *)(local_118 + 8);
        *(undefined8 *)dst = *(undefined8 *)local_118;
        *(undefined8 *)((long)dst + 8) = uVar6;
        if (0x10 < uVar27) {
          if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_108))
          goto LAB_00708db6;
          uVar6 = *(undefined8 *)(local_108 + 8);
          *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_108;
          *(undefined8 *)((long)dst + 0x18) = uVar6;
          if (0x20 < (long)uVar27) {
            lVar7 = 0;
            do {
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x20 + 8);
              pBVar24 = (BYTE *)((long)dst + lVar7 + 0x20);
              *(undefined8 *)pBVar24 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x20);
              *(undefined8 *)(pBVar24 + 8) = uVar6;
              uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x30 + 8);
              *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x30)
              ;
              *(undefined8 *)(pBVar24 + 0x18) = uVar6;
              lVar7 = lVar7 + 0x20;
            } while (pBVar24 + 0x20 < pBVar26);
          }
        }
        local_200 = local_118 + uVar27;
        pBVar24 = pBVar26 + -uVar25;
        if ((ulong)((long)pBVar26 - (long)prefixStart) < uVar25) {
          local_1e0 = pBVar9;
          if ((ulong)((long)pBVar26 - (long)local_1c0) < uVar25) {
            pBVar9 = (BYTE *)0xffffffffffffffec;
          }
          else {
            lVar7 = (long)(pBVar26 + -uVar25) - (long)prefixStart;
            pBVar9 = local_1d8 + lVar7;
            if (local_1d8 < pBVar9 + sVar17) {
              local_1d0 = uVar18;
              local_1c8 = pBVar21;
              memmove(pBVar26,pBVar9,-lVar7);
              pBVar26 = pBVar26 + -lVar7;
              sVar17 = sVar17 + lVar7;
              pBVar9 = local_1e0;
              pBVar21 = local_1c8;
              uVar18 = local_1d0;
              pBVar24 = prefixStart;
              goto LAB_00707947;
            }
            local_1d0 = uVar18;
            local_1c8 = pBVar21;
            memmove(pBVar26,pBVar9,sVar17);
            pBVar9 = local_1e0;
            pBVar21 = local_1c8;
            uVar18 = local_1d0;
          }
        }
        else {
LAB_00707947:
          if (local_1f8 < pBVar26) goto LAB_00708e8f;
          if (pBVar24 < prefixStart) goto LAB_00708eae;
          if (sVar17 == 0) goto LAB_00708e70;
          if (uVar25 < 0x10) {
            if (pBVar26 < pBVar24) goto LAB_00709022;
            if (uVar25 < 8) {
              iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar25 * 4);
              *pBVar26 = *pBVar24;
              pBVar26[1] = pBVar24[1];
              pBVar26[2] = pBVar24[2];
              pBVar26[3] = pBVar24[3];
              pBVar16 = pBVar24 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4);
              pBVar24 = pBVar24 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar25 * 4) -
                                  (long)iVar19);
              *(undefined4 *)(pBVar26 + 4) = *(undefined4 *)pBVar16;
            }
            else {
              *(undefined8 *)pBVar26 = *(undefined8 *)pBVar24;
            }
            pBVar13 = pBVar24 + 8;
            pBVar16 = pBVar26 + 8;
            lVar7 = (long)pBVar16 - (long)pBVar13;
            if (lVar7 < 8) goto LAB_00709041;
            if (8 < sVar17) {
              if (local_1f8 <= pBVar16) goto LAB_00709060;
              if (lVar7 < 0x10) {
                do {
                  *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
                  pBVar16 = pBVar16 + 8;
                  pBVar13 = pBVar13 + 8;
                } while (pBVar16 < pBVar26 + sVar17);
              }
              else {
                if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_00708db6;
                uVar6 = *(undefined8 *)(pBVar24 + 0x10);
                *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
                *(undefined8 *)(pBVar26 + 0x10) = uVar6;
                if (0x18 < (long)sVar17) {
                  lVar7 = 0;
                  do {
                    uVar6 = *(undefined8 *)(pBVar24 + lVar7 + 0x18 + 8);
                    pBVar16 = pBVar26 + lVar7 + 0x18;
                    *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar24 + lVar7 + 0x18);
                    *(undefined8 *)(pBVar16 + 8) = uVar6;
                    uVar6 = *(undefined8 *)(pBVar24 + lVar7 + 0x28 + 8);
                    *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar24 + lVar7 + 0x28);
                    *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                    lVar7 = lVar7 + 0x20;
                  } while (pBVar16 + 0x20 < pBVar26 + sVar17);
                }
              }
            }
          }
          else {
            if ((BYTE *)0xffffffffffffffe0 < pBVar26 + (-0x10 - (long)pBVar24)) goto LAB_00708db6;
            uVar6 = *(undefined8 *)(pBVar24 + 8);
            *(undefined8 *)pBVar26 = *(undefined8 *)pBVar24;
            *(undefined8 *)(pBVar26 + 8) = uVar6;
            if (0x10 < (long)sVar17) {
              lVar7 = 0x10;
              do {
                uVar6 = *(undefined8 *)(pBVar24 + lVar7 + 8);
                pBVar16 = pBVar26 + lVar7;
                *(undefined8 *)pBVar16 = *(undefined8 *)(pBVar24 + lVar7);
                *(undefined8 *)(pBVar16 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar24 + lVar7 + 0x10 + 8);
                *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(pBVar24 + lVar7 + 0x10);
                *(undefined8 *)(pBVar16 + 0x18) = uVar6;
                lVar7 = lVar7 + 0x20;
              } while (pBVar16 + 0x20 < pBVar26 + sVar17);
            }
          }
        }
      }
      else {
LAB_00707ca1:
        sequence_01.matchLength = local_f8[uVar20 * 3 + 1];
        sequence_01.litLength = *puVar23;
        sequence_01.offset = local_f8[uVar20 * 3 + 2];
        pBVar9 = (BYTE *)ZSTD_execSequenceEnd
                                   ((BYTE *)dst,local_1f0,sequence_01,&local_200,local_120,
                                    prefixStart,local_1c0,local_1d8);
      }
      local_1f8 = local_120;
      if (pBVar9 < (BYTE *)0xffffffffffffff89) {
        local_1e8 = local_1e8 + uVar18 + (long)local_110;
        *puVar23 = uVar18;
        local_f8[uVar20 * 3 + 1] = (ulong)local_110;
        local_f8[uVar20 * 3 + 2] = (ulong)pBVar21;
        dst = (void *)((long)dst + (long)pBVar9);
        goto LAB_007077c7;
      }
      bVar29 = false;
      goto LAB_007077d3;
    }
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00708f0b;
    pBVar26 = pBVar24 + -0x20;
    if (local_1f0 <= pBVar26) goto LAB_00708f2a;
    if (local_1f8 < pBVar24) {
LAB_00707b98:
      sequence_00.matchLength = local_f8[uVar20 * 3 + 1];
      sequence_00.litLength = *puVar23;
      sequence_00.offset = local_f8[uVar20 * 3 + 2];
      pBVar9 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                 ((BYTE *)dst,local_1f0,pBVar26,sequence_00,&local_200,local_1f8,
                                  prefixStart,local_1c0,local_1d8);
      goto LAB_00707766;
    }
    uVar25 = local_f8[uVar20 * 3 + 1];
    pBVar9 = (BYTE *)(uVar25 + uVar27);
    pBVar13 = (BYTE *)((long)dst + (long)pBVar9);
    if (pBVar26 < pBVar13) goto LAB_00707b98;
    if ((long)uVar27 < 0) goto LAB_00708f68;
    if ((long)pBVar9 <= (long)uVar27) goto LAB_00708f87;
    if (local_1f0 < pBVar13) goto LAB_00708f49;
    pBVar16 = (BYTE *)((long)dst + uVar27);
    if (pBVar26 < pBVar16) goto LAB_00708fa6;
    uVar20 = local_f8[uVar20 * 3 + 2];
    uVar6 = *(undefined8 *)(local_200 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_200;
    *(undefined8 *)((long)dst + 8) = uVar6;
    if (0x10 < uVar27) {
      local_1e0 = pBVar9;
      local_1d0 = uVar18;
      local_128 = pBVar13;
      ZSTD_decompressSequencesLong_cold_4();
      pBVar13 = local_128;
      pBVar9 = local_1e0;
      uVar18 = local_1d0;
    }
    pBVar26 = pBVar16 + -uVar20;
    local_200 = pBVar24;
    if ((ulong)((long)pBVar16 - (long)prefixStart) < uVar20) {
      local_128 = pBVar13;
      if ((ulong)((long)pBVar16 - (long)local_1c0) < uVar20) goto LAB_00707c3f;
      lVar7 = (long)(pBVar16 + -uVar20) - (long)prefixStart;
      pBVar24 = local_1d8 + lVar7;
      local_1e0 = pBVar9;
      local_1d0 = uVar18;
      if (pBVar24 + uVar25 <= local_1d8) goto LAB_00707739;
      local_1c8 = pBVar21;
      memmove(pBVar16,pBVar24,-lVar7);
      pBVar16 = pBVar16 + -lVar7;
      uVar25 = uVar25 + lVar7;
      pBVar13 = local_128;
      pBVar26 = prefixStart;
      pBVar9 = local_1e0;
      pBVar21 = local_1c8;
      uVar18 = local_1d0;
    }
    if (pBVar13 < pBVar16) goto LAB_00709003;
    if (pBVar26 < prefixStart) goto LAB_00708fe4;
    if (uVar25 == 0) goto LAB_00708fc5;
    if (uVar20 < 0x10) {
      if (pBVar16 < pBVar26) goto LAB_00709022;
      if (uVar20 < 8) {
        iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar20 * 4);
        *pBVar16 = *pBVar26;
        pBVar16[1] = pBVar26[1];
        pBVar16[2] = pBVar26[2];
        pBVar16[3] = pBVar26[3];
        pBVar24 = pBVar26 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar20 * 4);
        pBVar26 = pBVar26 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar20 * 4) -
                            (long)iVar19);
        *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar24;
      }
      else {
        *(undefined8 *)pBVar16 = *(undefined8 *)pBVar26;
      }
      pBVar24 = pBVar26 + 8;
      pBVar15 = pBVar16 + 8;
      lVar7 = (long)pBVar15 - (long)pBVar24;
      if (lVar7 < 8) goto LAB_00709041;
      if (uVar25 < 9) goto LAB_00707766;
      if (pBVar13 <= pBVar15) goto LAB_0070907f;
      if (lVar7 < 0x10) {
        do {
          *(undefined8 *)pBVar15 = *(undefined8 *)pBVar24;
          pBVar15 = pBVar15 + 8;
          pBVar24 = pBVar24 + 8;
        } while (pBVar15 < pBVar16 + uVar25);
      }
      else {
        if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_00708db6;
        uVar6 = *(undefined8 *)(pBVar26 + 0x10);
        *(undefined8 *)pBVar15 = *(undefined8 *)pBVar24;
        *(undefined8 *)(pBVar16 + 0x10) = uVar6;
        if (0x18 < (long)uVar25) {
          lVar7 = 0;
          do {
            uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x18 + 8);
            pBVar24 = pBVar16 + lVar7 + 0x18;
            *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar26 + lVar7 + 0x18);
            *(undefined8 *)(pBVar24 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x28 + 8);
            *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x28);
            *(undefined8 *)(pBVar24 + 0x18) = uVar6;
            lVar7 = lVar7 + 0x20;
          } while (pBVar24 + 0x20 < pBVar16 + uVar25);
        }
      }
    }
    else {
      if ((BYTE *)0xffffffffffffffe0 < pBVar16 + (-0x10 - (long)pBVar26)) goto LAB_00708db6;
      uVar6 = *(undefined8 *)(pBVar26 + 8);
      *(undefined8 *)pBVar16 = *(undefined8 *)pBVar26;
      *(undefined8 *)(pBVar16 + 8) = uVar6;
      if (0x10 < (long)uVar25) {
        lVar7 = 0x10;
        do {
          uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 8);
          pBVar24 = pBVar16 + lVar7;
          *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar26 + lVar7);
          *(undefined8 *)(pBVar24 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x10 + 8);
          *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x10);
          *(undefined8 *)(pBVar24 + 0x18) = uVar6;
          lVar7 = lVar7 + 0x20;
        } while (pBVar24 + 0x20 < pBVar16 + uVar25);
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00708dd5;
    uVar20 = (ulong)(uVar22 & 7);
    uVar27 = local_f8[uVar20 * 3];
    pBVar24 = local_200 + uVar27;
    if (local_1f8 < pBVar24) {
LAB_00707ae0:
      sequence.matchLength = local_f8[uVar20 * 3 + 1];
      sequence.litLength = local_f8[uVar20 * 3];
      sequence.offset = local_f8[uVar20 * 3 + 2];
      pBVar9 = (BYTE *)ZSTD_execSequenceEnd
                                 ((BYTE *)dst,local_1f0,sequence,&local_200,local_1f8,prefixStart,
                                  local_1c0,local_1d8);
    }
    else {
      uVar25 = local_f8[uVar20 * 3 + 1];
      pBVar9 = (BYTE *)(uVar25 + uVar27);
      pBVar26 = (BYTE *)((long)dst + (long)pBVar9);
      if (local_130 < pBVar26) goto LAB_00707ae0;
      if ((long)uVar27 < 0) goto LAB_00708e13;
      if ((long)pBVar9 <= (long)uVar27) goto LAB_00708df4;
      if (local_1f0 < pBVar26) goto LAB_00708e32;
      pBVar16 = (BYTE *)((long)dst + uVar27);
      if (local_130 < pBVar16) goto LAB_00708e51;
      uVar20 = local_f8[uVar20 * 3 + 2];
      uVar6 = *(undefined8 *)(local_200 + 8);
      *(undefined8 *)dst = *(undefined8 *)local_200;
      *(undefined8 *)((long)dst + 8) = uVar6;
      if (0x10 < uVar27) {
        local_1e0 = pBVar9;
        local_128 = pBVar26;
        ZSTD_decompressSequencesLong_cold_3();
        pBVar9 = local_1e0;
        pBVar26 = local_128;
      }
      pBVar13 = pBVar16 + -uVar20;
      local_200 = pBVar24;
      if ((ulong)((long)pBVar16 - (long)prefixStart) < uVar20) {
        if ((ulong)((long)pBVar16 - (long)local_1c0) < uVar20) {
LAB_00707c3f:
          pBVar9 = (BYTE *)0xffffffffffffffec;
        }
        else {
          lVar7 = (long)pBVar13 - (long)prefixStart;
          pBVar24 = local_1d8 + lVar7;
          local_1e0 = pBVar9;
          local_1d0 = uVar18;
          local_128 = pBVar26;
          if (local_1d8 < pBVar24 + uVar25) {
            local_1c8 = pBVar21;
            memmove(pBVar16,pBVar24,-lVar7);
            pBVar16 = pBVar16 + -lVar7;
            uVar25 = uVar25 + lVar7;
            pBVar13 = prefixStart;
            pBVar9 = local_1e0;
            pBVar21 = local_1c8;
            uVar18 = local_1d0;
            pBVar26 = local_128;
            goto LAB_007076c6;
          }
LAB_00707739:
          local_1c8 = pBVar21;
          memmove(pBVar16,pBVar24,uVar25);
          pBVar9 = local_1e0;
          pBVar21 = local_1c8;
          uVar18 = local_1d0;
        }
      }
      else {
LAB_007076c6:
        if (pBVar26 < pBVar16) goto LAB_00708e8f;
        if (pBVar13 < prefixStart) goto LAB_00708eae;
        if (uVar25 == 0) goto LAB_00708e70;
        if (uVar20 < 0x10) {
          if (pBVar16 < pBVar13) goto LAB_00709022;
          if (uVar20 < 8) {
            iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar20 * 4);
            *pBVar16 = *pBVar13;
            pBVar16[1] = pBVar13[1];
            pBVar16[2] = pBVar13[2];
            pBVar16[3] = pBVar13[3];
            pBVar24 = pBVar13 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar20 * 4);
            pBVar13 = pBVar13 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar20 * 4) -
                                (long)iVar19);
            *(undefined4 *)(pBVar16 + 4) = *(undefined4 *)pBVar24;
          }
          else {
            *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
          }
          pBVar24 = pBVar13 + 8;
          pBVar15 = pBVar16 + 8;
          lVar7 = (long)pBVar15 - (long)pBVar24;
          if (lVar7 < 8) goto LAB_00709041;
          if (8 < uVar25) {
            if (pBVar26 <= pBVar15) goto LAB_00709060;
            if (lVar7 < 0x10) {
              do {
                *(undefined8 *)pBVar15 = *(undefined8 *)pBVar24;
                pBVar15 = pBVar15 + 8;
                pBVar24 = pBVar24 + 8;
              } while (pBVar15 < pBVar16 + uVar25);
            }
            else {
              if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_00708db6;
              uVar6 = *(undefined8 *)(pBVar13 + 0x10);
              *(undefined8 *)pBVar15 = *(undefined8 *)pBVar24;
              *(undefined8 *)(pBVar16 + 0x10) = uVar6;
              if (0x18 < (long)uVar25) {
                lVar7 = 0;
                do {
                  uVar6 = *(undefined8 *)(pBVar13 + lVar7 + 0x18 + 8);
                  pBVar24 = pBVar16 + lVar7 + 0x18;
                  *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar13 + lVar7 + 0x18);
                  *(undefined8 *)(pBVar24 + 8) = uVar6;
                  uVar6 = *(undefined8 *)(pBVar13 + lVar7 + 0x28 + 8);
                  *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar13 + lVar7 + 0x28);
                  *(undefined8 *)(pBVar24 + 0x18) = uVar6;
                  lVar7 = lVar7 + 0x20;
                } while (pBVar24 + 0x20 < pBVar16 + uVar25);
              }
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < pBVar16 + (-0x10 - (long)pBVar13)) goto LAB_00708db6;
          uVar6 = *(undefined8 *)(pBVar13 + 8);
          *(undefined8 *)pBVar16 = *(undefined8 *)pBVar13;
          *(undefined8 *)(pBVar16 + 8) = uVar6;
          if (0x10 < (long)uVar25) {
            lVar7 = 0x10;
            do {
              uVar6 = *(undefined8 *)(pBVar13 + lVar7 + 8);
              pBVar24 = pBVar16 + lVar7;
              *(undefined8 *)pBVar24 = *(undefined8 *)(pBVar13 + lVar7);
              *(undefined8 *)(pBVar24 + 8) = uVar6;
              uVar6 = *(undefined8 *)(pBVar13 + lVar7 + 0x10 + 8);
              *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)(pBVar13 + lVar7 + 0x10);
              *(undefined8 *)(pBVar24 + 0x18) = uVar6;
              lVar7 = lVar7 + 0x20;
            } while (pBVar24 + 0x20 < pBVar16 + uVar25);
          }
        }
      }
    }
  }
LAB_00707766:
  if (pBVar9 < (BYTE *)0xffffffffffffff89) {
    local_1e8 = local_1e8 + uVar18 + (long)local_110;
    uVar27 = (ulong)(uVar22 & 7);
    local_f8[uVar27 * 3] = uVar18;
    local_f8[uVar27 * 3 + 1] = (ulong)local_110;
    local_f8[uVar27 * 3 + 2] = (ulong)pBVar21;
    dst = (void *)((long)dst + (long)pBVar9);
LAB_007077c7:
    bVar29 = true;
    pBVar9 = local_1b8;
  }
  else {
LAB_007077d1:
    bVar29 = false;
  }
LAB_007077d3:
  if (!bVar29) goto LAB_0070810d;
  uVar18 = (ulong)(uVar22 + 1);
  local_1b8 = pBVar9;
  goto LAB_0070704d;
LAB_007080f7:
  bVar29 = false;
  pBVar9 = (BYTE *)0xffffffffffffffec;
  pBVar21 = local_1f8;
  goto LAB_00708c45;
joined_r0x00708122:
  local_1b8 = pBVar9;
  local_1f8 = pBVar21;
  if (nbSeq <= (int)uVar22) goto LAB_00708c1d;
  uVar18 = (ulong)(uVar22 & 7);
  puVar23 = local_f8 + uVar18 * 3;
  if (dctx->litBufferLocation == ZSTD_split) {
    uVar27 = *puVar23;
    pBVar9 = local_200 + uVar27;
    if (dctx->litBufferEnd < pBVar9) {
      uVar27 = (long)dctx->litBufferEnd - (long)local_200;
      if (uVar27 == 0) {
LAB_0070851f:
        local_200 = local_118;
        dctx->litBufferLocation = ZSTD_not_in_dst;
        if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00708dd5:
          __assert_fail("op != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x3d0,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar27 = *puVar23;
        if ((long)uVar27 < 0x10001) {
          sVar17 = local_f8[uVar18 * 3 + 1];
          pBVar9 = (BYTE *)(uVar27 + sVar17);
          pBVar21 = (BYTE *)((long)dst + (long)pBVar9);
          if (local_130 < pBVar21) goto LAB_00708862;
          if ((long)uVar27 < 0) {
LAB_00708e13:
            __assert_fail("op <= oLitEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e3,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if ((long)pBVar9 <= (long)uVar27) {
LAB_00708df4:
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e4,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_1f0 < pBVar21) {
LAB_00708e32:
            __assert_fail("oMatchEnd <= oend",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,0x3e5,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          pBVar24 = (BYTE *)((long)dst + uVar27);
          if (local_130 < pBVar24) {
LAB_00708e51:
            __assert_fail("oLitEnd <= oend_w",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                          ,999,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          uVar18 = local_f8[uVar18 * 3 + 2];
          uVar6 = *(undefined8 *)(local_118 + 8);
          *(undefined8 *)dst = *(undefined8 *)local_118;
          *(undefined8 *)((long)dst + 8) = uVar6;
          if (0x10 < uVar27) {
            if ((BYTE *)0xffffffffffffffe0 < (BYTE *)((long)dst + 0x10) + (-0x10 - (long)local_108))
            {
LAB_00708db6:
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar6 = *(undefined8 *)(local_108 + 8);
            *(undefined8 *)((long)dst + 0x10) = *(undefined8 *)local_108;
            *(undefined8 *)((long)dst + 0x18) = uVar6;
            if (0x20 < (long)uVar27) {
              lVar7 = 0;
              do {
                uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x20 + 8);
                pBVar26 = (BYTE *)((long)dst + lVar7 + 0x20);
                *(undefined8 *)pBVar26 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x20);
                *(undefined8 *)(pBVar26 + 8) = uVar6;
                uVar6 = *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x30 + 8);
                *(undefined8 *)(pBVar26 + 0x10) =
                     *(undefined8 *)(dctx->litExtraBuffer + lVar7 + 0x30);
                *(undefined8 *)(pBVar26 + 0x18) = uVar6;
                lVar7 = lVar7 + 0x20;
              } while (pBVar26 + 0x20 < pBVar24);
            }
          }
          local_200 = local_118 + uVar27;
          pBVar26 = pBVar24 + -uVar18;
          if ((ulong)((long)pBVar24 - (long)prefixStart) < uVar18) {
            if ((ulong)((long)pBVar24 - (long)local_1c0) < uVar18) {
              pBVar9 = (BYTE *)0xffffffffffffffec;
            }
            else {
              lVar7 = (long)pBVar26 - (long)prefixStart;
              pBVar26 = local_1d8 + lVar7;
              if (local_1d8 < pBVar26 + sVar17) {
                memmove(pBVar24,pBVar26,-lVar7);
                pBVar24 = pBVar24 + -lVar7;
                sVar17 = sVar17 + lVar7;
                pBVar26 = prefixStart;
                goto LAB_00708630;
              }
              memmove(pBVar24,pBVar26,sVar17);
            }
          }
          else {
LAB_00708630:
            if (pBVar21 < pBVar24) {
LAB_00708e8f:
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x408,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (pBVar26 < prefixStart) {
LAB_00708eae:
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x40a,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (sVar17 == 0) {
LAB_00708e70:
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                            ,0x40b,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (uVar18 < 0x10) {
              if (pBVar24 < pBVar26) {
LAB_00709022:
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x303,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (uVar18 < 8) {
                iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar18 * 4);
                *pBVar24 = *pBVar26;
                pBVar24[1] = pBVar26[1];
                pBVar24[2] = pBVar26[2];
                pBVar24[3] = pBVar26[3];
                pBVar16 = pBVar26 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4);
                pBVar26 = pBVar26 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4) -
                                    (long)iVar19);
                *(undefined4 *)(pBVar24 + 4) = *(undefined4 *)pBVar16;
              }
              else {
                *(undefined8 *)pBVar24 = *(undefined8 *)pBVar26;
              }
              pBVar16 = pBVar26 + 8;
              pBVar13 = pBVar24 + 8;
              lVar7 = (long)pBVar13 - (long)pBVar16;
              if (lVar7 < 8) {
LAB_00709041:
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                              ,0x315,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (8 < sVar17) {
                if (pBVar21 <= pBVar13) {
LAB_00709060:
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                                ,0x41f,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                if (lVar7 < 0x10) {
                  do {
                    *(undefined8 *)pBVar13 = *(undefined8 *)pBVar16;
                    pBVar13 = pBVar13 + 8;
                    pBVar16 = pBVar16 + 8;
                  } while (pBVar13 < pBVar24 + sVar17);
                }
                else {
                  if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_00708db6;
                  uVar6 = *(undefined8 *)(pBVar26 + 0x10);
                  *(undefined8 *)pBVar13 = *(undefined8 *)pBVar16;
                  *(undefined8 *)(pBVar24 + 0x10) = uVar6;
                  if (0x18 < (long)sVar17) {
                    lVar7 = 0;
                    do {
                      uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x18 + 8);
                      pBVar21 = pBVar24 + lVar7 + 0x18;
                      *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar26 + lVar7 + 0x18);
                      *(undefined8 *)(pBVar21 + 8) = uVar6;
                      uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x28 + 8);
                      *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x28);
                      *(undefined8 *)(pBVar21 + 0x18) = uVar6;
                      lVar7 = lVar7 + 0x20;
                    } while (pBVar21 + 0x20 < pBVar24 + sVar17);
                  }
                }
              }
            }
            else {
              if ((BYTE *)0xffffffffffffffe0 < pBVar24 + (-0x10 - (long)pBVar26)) goto LAB_00708db6;
              uVar6 = *(undefined8 *)(pBVar26 + 8);
              *(undefined8 *)pBVar24 = *(undefined8 *)pBVar26;
              *(undefined8 *)(pBVar24 + 8) = uVar6;
              if (0x10 < (long)sVar17) {
                lVar7 = 0x10;
                do {
                  uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 8);
                  pBVar21 = pBVar24 + lVar7;
                  *(undefined8 *)pBVar21 = *(undefined8 *)(pBVar26 + lVar7);
                  *(undefined8 *)(pBVar21 + 8) = uVar6;
                  uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x10 + 8);
                  *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x10);
                  *(undefined8 *)(pBVar21 + 0x18) = uVar6;
                  lVar7 = lVar7 + 0x20;
                } while (pBVar21 + 0x20 < pBVar24 + sVar17);
              }
            }
          }
        }
        else {
LAB_00708862:
          sequence_04.matchLength = local_f8[uVar18 * 3 + 1];
          sequence_04.litLength = *puVar23;
          sequence_04.offset = local_f8[uVar18 * 3 + 2];
          pBVar9 = (BYTE *)ZSTD_execSequenceEnd
                                     ((BYTE *)dst,local_1f0,sequence_04,&local_200,local_120,
                                      prefixStart,local_1c0,local_1d8);
        }
        bVar29 = pBVar9 < (BYTE *)0xffffffffffffff89;
        if (!bVar29) {
          local_1b8 = pBVar9;
          pBVar9 = (BYTE *)0x0;
        }
        dst = (void *)((long)dst + (long)pBVar9);
        local_1f8 = local_120;
      }
      else {
        if (uVar27 <= (ulong)((long)local_1f0 - (long)dst)) {
          ZSTD_safecopyDstBeforeSrc((BYTE *)dst,local_200,uVar27);
          *puVar23 = *puVar23 - uVar27;
          dst = (void *)((long)dst + uVar27);
          goto LAB_0070851f;
        }
        local_1b8 = (BYTE *)0xffffffffffffffba;
        bVar29 = false;
      }
      if (bVar29) goto LAB_007086fd;
      bVar29 = false;
      goto LAB_00708705;
    }
    if ((BYTE *)dst == (BYTE *)0x0) {
LAB_00708f0b:
      __assert_fail("op != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x431,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pBVar26 = pBVar9 + -0x20;
    if (local_1f0 <= pBVar26) {
LAB_00708f2a:
      __assert_fail("oend_w < oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x432,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (pBVar21 < pBVar9) {
LAB_00708771:
      sequence_03.matchLength = local_f8[uVar18 * 3 + 1];
      sequence_03.litLength = *puVar23;
      sequence_03.offset = local_f8[uVar18 * 3 + 2];
      pBVar24 = (BYTE *)ZSTD_execSequenceEndSplitLitBuffer
                                  ((BYTE *)dst,local_1f0,pBVar26,sequence_03,&local_200,pBVar21,
                                   prefixStart,local_1c0,local_1d8);
      goto LAB_007084cf;
    }
    uVar20 = local_f8[uVar18 * 3 + 1];
    pBVar24 = (BYTE *)(uVar20 + uVar27);
    pBVar16 = (BYTE *)((long)dst + (long)pBVar24);
    if (pBVar26 < pBVar16) goto LAB_00708771;
    if ((long)uVar27 < 0) {
LAB_00708f68:
      __assert_fail("op <= oLitEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x43f,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if ((long)pBVar24 <= (long)uVar27) {
LAB_00708f87:
      __assert_fail("oLitEnd < oMatchEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x440,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (local_1f0 < pBVar16) {
LAB_00708f49:
      __assert_fail("oMatchEnd <= oend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x441,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    pBVar21 = (BYTE *)((long)dst + uVar27);
    if (pBVar26 < pBVar21) {
LAB_00708fa6:
      __assert_fail("oLitEnd <= oend_w",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x443,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    uVar18 = local_f8[uVar18 * 3 + 2];
    uVar6 = *(undefined8 *)(local_200 + 8);
    *(undefined8 *)dst = *(undefined8 *)local_200;
    *(undefined8 *)((long)dst + 8) = uVar6;
    if (0x10 < uVar27) {
      local_1e8 = pBVar24;
      ZSTD_decompressSequencesLong_cold_2();
      pBVar24 = local_1e8;
    }
    pBVar26 = pBVar21 + -uVar18;
    local_200 = pBVar9;
    if ((ulong)((long)pBVar21 - (long)prefixStart) < uVar18) {
      local_1e8 = pBVar24;
      if ((ulong)((long)pBVar21 - (long)local_1c0) < uVar18) goto LAB_007087f4;
      lVar7 = (long)pBVar26 - (long)prefixStart;
      pBVar9 = local_1d8 + lVar7;
      if (pBVar9 + uVar20 <= local_1d8) goto LAB_00708438;
      memmove(pBVar21,pBVar9,-lVar7);
      pBVar21 = pBVar21 + -lVar7;
      uVar20 = uVar20 + lVar7;
      pBVar24 = local_1e8;
      pBVar26 = prefixStart;
    }
    if (pBVar16 < pBVar21) {
LAB_00709003:
      __assert_fail("op <= oMatchEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x463,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (pBVar26 < prefixStart) {
LAB_00708fe4:
      __assert_fail("match >= prefixStart",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x465,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (uVar20 == 0) {
LAB_00708fc5:
      __assert_fail("sequence.matchLength >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                    ,0x466,
                    "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                   );
    }
    if (uVar18 < 0x10) {
      if (pBVar21 < pBVar26) goto LAB_00709022;
      if (uVar18 < 8) {
        iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar18 * 4);
        *pBVar21 = *pBVar26;
        pBVar21[1] = pBVar26[1];
        pBVar21[2] = pBVar26[2];
        pBVar21[3] = pBVar26[3];
        pBVar9 = pBVar26 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4);
        pBVar26 = pBVar26 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4) -
                            (long)iVar19);
        *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)pBVar9;
      }
      else {
        *(undefined8 *)pBVar21 = *(undefined8 *)pBVar26;
      }
      pBVar9 = pBVar26 + 8;
      pBVar13 = pBVar21 + 8;
      lVar7 = (long)pBVar13 - (long)pBVar9;
      if (lVar7 < 8) goto LAB_00709041;
      if (8 < uVar20) {
        if (pBVar16 <= pBVar13) {
LAB_0070907f:
          __assert_fail("op < oMatchEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/zstd_decompress_block.c"
                        ,0x47a,
                        "size_t ZSTD_execSequenceSplitLitBuffer(BYTE *, BYTE *const, const BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (0xf < lVar7) {
          if (lVar7 - 0x10U < 0xffffffffffffffe1) {
            uVar6 = *(undefined8 *)(pBVar26 + 0x10);
            *(undefined8 *)pBVar13 = *(undefined8 *)pBVar9;
            *(undefined8 *)(pBVar21 + 0x10) = uVar6;
            if (0x18 < (long)uVar20) {
              lVar7 = 0;
              do {
                uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x18 + 8);
                pBVar9 = pBVar21 + lVar7 + 0x18;
                *(undefined8 *)pBVar9 = *(undefined8 *)(pBVar26 + lVar7 + 0x18);
                *(undefined8 *)(pBVar9 + 8) = uVar6;
                uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x28 + 8);
                *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x28);
                *(undefined8 *)(pBVar9 + 0x18) = uVar6;
                lVar7 = lVar7 + 0x20;
              } while (pBVar9 + 0x20 < pBVar21 + uVar20);
            }
            goto LAB_007084cf;
          }
          goto LAB_00708db6;
        }
        do {
          *(undefined8 *)pBVar13 = *(undefined8 *)pBVar9;
          pBVar13 = pBVar13 + 8;
          pBVar9 = pBVar9 + 8;
        } while (pBVar13 < pBVar21 + uVar20);
      }
    }
    else {
      if ((BYTE *)0xffffffffffffffe0 < pBVar21 + (-0x10 - (long)pBVar26)) goto LAB_00708db6;
      uVar6 = *(undefined8 *)(pBVar26 + 8);
      *(undefined8 *)pBVar21 = *(undefined8 *)pBVar26;
      *(undefined8 *)(pBVar21 + 8) = uVar6;
      if (0x10 < (long)uVar20) {
        lVar7 = 0x10;
        do {
          uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 8);
          pBVar9 = pBVar21 + lVar7;
          *(undefined8 *)pBVar9 = *(undefined8 *)(pBVar26 + lVar7);
          *(undefined8 *)(pBVar9 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pBVar26 + lVar7 + 0x10 + 8);
          *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)(pBVar26 + lVar7 + 0x10);
          *(undefined8 *)(pBVar9 + 0x18) = uVar6;
          lVar7 = lVar7 + 0x20;
        } while (pBVar9 + 0x20 < pBVar21 + uVar20);
      }
    }
  }
  else {
    if ((BYTE *)dst == (BYTE *)0x0) goto LAB_00708dd5;
    uVar27 = *puVar23;
    pBVar9 = local_200 + uVar27;
    if (pBVar21 < pBVar9) {
LAB_0070871f:
      sequence_02.matchLength = local_f8[uVar18 * 3 + 1];
      sequence_02.litLength = *puVar23;
      sequence_02.offset = local_f8[uVar18 * 3 + 2];
      pBVar24 = (BYTE *)ZSTD_execSequenceEnd
                                  ((BYTE *)dst,local_1f0,sequence_02,&local_200,pBVar21,prefixStart,
                                   local_1c0,local_1d8);
    }
    else {
      uVar20 = local_f8[uVar18 * 3 + 1];
      pBVar24 = (BYTE *)(uVar20 + uVar27);
      pBVar26 = (BYTE *)((long)dst + (long)pBVar24);
      if (local_130 < pBVar26) goto LAB_0070871f;
      if ((long)uVar27 < 0) goto LAB_00708e13;
      if ((long)pBVar24 <= (long)uVar27) goto LAB_00708df4;
      if (local_1f0 < pBVar26) goto LAB_00708e32;
      pBVar21 = (BYTE *)((long)dst + uVar27);
      if (local_130 < pBVar21) goto LAB_00708e51;
      uVar18 = local_f8[uVar18 * 3 + 2];
      uVar6 = *(undefined8 *)(local_200 + 8);
      *(undefined8 *)dst = *(undefined8 *)local_200;
      *(undefined8 *)((long)dst + 8) = uVar6;
      if (0x10 < uVar27) {
        local_1e8 = pBVar24;
        ZSTD_decompressSequencesLong_cold_1();
        pBVar24 = local_1e8;
      }
      pBVar16 = pBVar21 + -uVar18;
      local_200 = pBVar9;
      if ((ulong)((long)pBVar21 - (long)prefixStart) < uVar18) {
        local_1e8 = pBVar24;
        if ((ulong)((long)pBVar21 - (long)local_1c0) < uVar18) {
LAB_007087f4:
          pBVar24 = (BYTE *)0xffffffffffffffec;
        }
        else {
          lVar7 = (long)pBVar16 - (long)prefixStart;
          pBVar9 = local_1d8 + lVar7;
          if (local_1d8 < pBVar9 + uVar20) {
            memmove(pBVar21,pBVar9,-lVar7);
            pBVar21 = pBVar21 + -lVar7;
            uVar20 = uVar20 + lVar7;
            pBVar24 = local_1e8;
            pBVar16 = prefixStart;
            goto LAB_007083bc;
          }
LAB_00708438:
          memmove(pBVar21,pBVar9,uVar20);
          pBVar24 = local_1e8;
        }
      }
      else {
LAB_007083bc:
        if (pBVar26 < pBVar21) goto LAB_00708e8f;
        if (pBVar16 < prefixStart) goto LAB_00708eae;
        if (uVar20 == 0) goto LAB_00708e70;
        if (uVar18 < 0x10) {
          if (pBVar21 < pBVar16) goto LAB_00709022;
          if (uVar18 < 8) {
            iVar19 = *(int *)(ZSTD_overlapCopy8_dec64table + uVar18 * 4);
            *pBVar21 = *pBVar16;
            pBVar21[1] = pBVar16[1];
            pBVar21[2] = pBVar16[2];
            pBVar21[3] = pBVar16[3];
            pBVar9 = pBVar16 + *(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4);
            pBVar16 = pBVar16 + ((ulong)*(uint *)(ZSTD_overlapCopy8_dec32table + uVar18 * 4) -
                                (long)iVar19);
            *(undefined4 *)(pBVar21 + 4) = *(undefined4 *)pBVar9;
          }
          else {
            *(undefined8 *)pBVar21 = *(undefined8 *)pBVar16;
          }
          pBVar9 = pBVar16 + 8;
          pBVar13 = pBVar21 + 8;
          lVar7 = (long)pBVar13 - (long)pBVar9;
          if (lVar7 < 8) goto LAB_00709041;
          if (8 < uVar20) {
            if (pBVar26 <= pBVar13) goto LAB_00709060;
            if (lVar7 < 0x10) {
              do {
                *(undefined8 *)pBVar13 = *(undefined8 *)pBVar9;
                pBVar13 = pBVar13 + 8;
                pBVar9 = pBVar9 + 8;
              } while (pBVar13 < pBVar21 + uVar20);
            }
            else {
              if (0xffffffffffffffe0 < lVar7 - 0x10U) goto LAB_00708db6;
              uVar6 = *(undefined8 *)(pBVar16 + 0x10);
              *(undefined8 *)pBVar13 = *(undefined8 *)pBVar9;
              *(undefined8 *)(pBVar21 + 0x10) = uVar6;
              if (0x18 < (long)uVar20) {
                lVar7 = 0;
                do {
                  uVar6 = *(undefined8 *)(pBVar16 + lVar7 + 0x18 + 8);
                  pBVar9 = pBVar21 + lVar7 + 0x18;
                  *(undefined8 *)pBVar9 = *(undefined8 *)(pBVar16 + lVar7 + 0x18);
                  *(undefined8 *)(pBVar9 + 8) = uVar6;
                  uVar6 = *(undefined8 *)(pBVar16 + lVar7 + 0x28 + 8);
                  *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)(pBVar16 + lVar7 + 0x28);
                  *(undefined8 *)(pBVar9 + 0x18) = uVar6;
                  lVar7 = lVar7 + 0x20;
                } while (pBVar9 + 0x20 < pBVar21 + uVar20);
              }
            }
          }
        }
        else {
          if ((BYTE *)0xffffffffffffffe0 < pBVar21 + (-0x10 - (long)pBVar16)) goto LAB_00708db6;
          uVar6 = *(undefined8 *)(pBVar16 + 8);
          *(undefined8 *)pBVar21 = *(undefined8 *)pBVar16;
          *(undefined8 *)(pBVar21 + 8) = uVar6;
          if (0x10 < (long)uVar20) {
            lVar7 = 0x10;
            do {
              uVar6 = *(undefined8 *)(pBVar16 + lVar7 + 8);
              pBVar9 = pBVar21 + lVar7;
              *(undefined8 *)pBVar9 = *(undefined8 *)(pBVar16 + lVar7);
              *(undefined8 *)(pBVar9 + 8) = uVar6;
              uVar6 = *(undefined8 *)(pBVar16 + lVar7 + 0x10 + 8);
              *(undefined8 *)(pBVar9 + 0x10) = *(undefined8 *)(pBVar16 + lVar7 + 0x10);
              *(undefined8 *)(pBVar9 + 0x18) = uVar6;
              lVar7 = lVar7 + 0x20;
            } while (pBVar9 + 0x20 < pBVar21 + uVar20);
          }
        }
      }
    }
  }
LAB_007084cf:
  bVar29 = false;
  pBVar9 = pBVar24;
  if ((BYTE *)0xffffffffffffff88 < pBVar24) {
    local_1b8 = pBVar24;
    pBVar9 = (BYTE *)0x0;
  }
  dst = (void *)((long)dst + (long)pBVar9);
  if (pBVar24 < (BYTE *)0xffffffffffffff89) {
LAB_007086fd:
    bVar29 = true;
  }
LAB_00708705:
  pBVar9 = local_1b8;
  if (!bVar29) goto LAB_0070810d;
  uVar22 = uVar22 + 1;
  pBVar21 = local_1f8;
  goto joined_r0x00708122;
LAB_0070810d:
  bVar29 = false;
  pBVar21 = local_1f8;
  goto LAB_00708c45;
LAB_00708c1d:
  lVar7 = 0;
  do {
    (dctx->entropy).rep[lVar7] = *(U32 *)(local_150 + lVar7);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  bVar29 = true;
LAB_00708c45:
  if (bVar29) {
LAB_00708c55:
    if (dctx->litBufferLocation == ZSTD_split) {
      uVar27 = (long)pBVar21 - (long)local_200;
      uVar18 = (long)local_1f0 - (long)dst;
      if (uVar18 < uVar27) {
        pBVar9 = (BYTE *)0xffffffffffffffba;
      }
      else {
        if ((BYTE *)dst == (BYTE *)0x0) {
          dst = (BYTE *)0x0;
        }
        else {
          memmove(dst,local_200,uVar27);
          dst = (void *)((long)dst + uVar27);
        }
        local_200 = dctx->litExtraBuffer;
        pBVar21 = dctx->litExtraBuffer + 0x10000;
      }
      if (uVar18 < uVar27) {
        return (size_t)pBVar9;
      }
    }
    sVar17 = (long)pBVar21 - (long)local_200;
    uVar18 = (long)local_1f0 - (long)dst;
    if (uVar18 < sVar17) {
      pBVar9 = (BYTE *)0xffffffffffffffba;
    }
    else if ((BYTE *)dst == (BYTE *)0x0) {
      dst = (BYTE *)0x0;
    }
    else {
      memmove(dst,local_200,sVar17);
      dst = (void *)((long)dst + sVar17);
    }
    if (sVar17 <= uVar18) {
      pBVar9 = (BYTE *)((long)dst + -(long)local_1b0);
    }
  }
  return (size_t)pBVar9;
}

Assistant:

static size_t
ZSTD_decompressSequencesLong(ZSTD_DCtx* dctx,
                             void* dst, size_t maxDstSize,
                             const void* seqStart, size_t seqSize, int nbSeq,
                             const ZSTD_longOffset_e isLongOffset,
                             const int frame)
{
    DEBUGLOG(5, "ZSTD_decompressSequencesLong");
#if DYNAMIC_BMI2
    if (ZSTD_DCtx_get_bmi2(dctx)) {
        return ZSTD_decompressSequencesLong_bmi2(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
    }
#endif
  return ZSTD_decompressSequencesLong_default(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}